

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O2

size_t rtosc_amessage(char *buffer,size_t len,char *address,char *arguments,rtosc_arg_t *args)

{
  uint uVar1;
  int32_t iVar2;
  int iVar3;
  int64_t iVar4;
  char cVar5;
  uint uVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  size_t __n;
  char *pcVar16;
  
  sVar7 = strlen(address);
  sVar8 = strlen(arguments);
  uVar13 = ((int)sVar8 + ((int)sVar7 + 4U & 0xfffffffc) + 1 & 0xfffffffc) + 4;
  uVar6 = nreserved(arguments);
  uVar15 = 0;
  pcVar16 = arguments;
switchD_00114372_caseD_65:
  if (uVar6 == 0) goto LAB_001143b7;
  cVar5 = *pcVar16;
  pcVar16 = pcVar16 + 1;
  switch(cVar5) {
  case 'b':
    uVar13 = uVar13 + args[uVar15].i + 7 & 0xfffffffc;
    break;
  case 'c':
  case 'f':
  case 'i':
  case 'm':
  case 'r':
    goto switchD_00114372_caseD_63;
  case 'd':
  case 'h':
  case 't':
    uVar13 = uVar13 + 8;
    break;
  case 'e':
  case 'g':
  case 'j':
  case 'k':
  case 'l':
  case 'n':
  case 'o':
  case 'p':
  case 'q':
    goto switchD_00114372_caseD_65;
  case 's':
    goto switchD_00114372_caseD_73;
  default:
    if (cVar5 != 'S') goto switchD_00114372_caseD_65;
switchD_00114372_caseD_73:
    sVar7 = strlen(args[uVar15].s);
    uVar13 = uVar13 + (int)sVar7 & 0xfffffffc;
switchD_00114372_caseD_63:
    uVar13 = uVar13 + 4;
  }
  uVar6 = uVar6 - 1;
  uVar15 = (ulong)((int)uVar15 + 1);
  goto switchD_00114372_caseD_65;
LAB_001143b7:
  __n = (size_t)uVar13;
  if (buffer != (char *)0x0) {
    if (__n <= len) {
      uVar15 = 0;
      memset(buffer,0,__n);
      while( true ) {
        if (address[uVar15] == '\0') break;
        buffer[uVar15 & 0xffffffff] = address[uVar15];
        uVar15 = uVar15 + 1;
      }
      uVar6 = ((uint)uVar15 & 0xfffffffc) + 4;
      cVar5 = ',';
      pcVar16 = arguments;
      while( true ) {
        buffer[uVar6] = cVar5;
        cVar5 = *pcVar16;
        if (cVar5 == '\0') break;
        pcVar16 = pcVar16 + 1;
        uVar6 = uVar6 + 1;
      }
      uVar14 = (uVar6 + 1 & 0xfffffffc) + 4;
      uVar6 = nreserved(arguments);
      uVar13 = 0;
switchD_0011447f_caseD_65:
      uVar15 = (ulong)uVar14;
      if (uVar6 == 0) {
        return uVar15;
      }
      cVar5 = *arguments;
      arguments = arguments + 1;
      uVar9 = (ulong)uVar13;
      switch(cVar5) {
      case 'b':
        iVar3 = args[uVar9].i;
        lVar10 = *(long *)((long)args + uVar9 * 0x10 + 8);
        buffer[uVar15] = (char)((uint)iVar3 >> 0x18);
        buffer[uVar14 + 1] = (char)((uint)iVar3 >> 0x10);
        buffer[uVar14 + 2] = (char)((uint)iVar3 >> 8);
        buffer[uVar14 + 3] = (char)iVar3;
        iVar11 = iVar3;
        if (lVar10 != 0) {
          for (lVar12 = 0; iVar11 = (int)lVar12, iVar3 != iVar11; lVar12 = lVar12 + 1) {
            buffer[(ulong)(uVar14 + 4) + lVar12 & 0xffffffff] = *(char *)(lVar10 + lVar12);
          }
        }
        uVar14 = uVar14 + 4 + iVar11 + 3 & 0xfffffffc;
        break;
      case 'c':
      case 'f':
      case 'i':
      case 'r':
        iVar2 = args[uVar9].i;
        buffer[uVar15] = (char)((uint)iVar2 >> 0x18);
        buffer[uVar14 + 1] = (char)((uint)iVar2 >> 0x10);
        uVar1 = uVar14 + 3;
        buffer[uVar14 + 2] = (char)((uint)iVar2 >> 8);
        uVar14 = uVar14 + 4;
        buffer[uVar1] = (char)iVar2;
        break;
      case 'd':
      case 'h':
      case 't':
        iVar4 = args[uVar9].h;
        buffer[uVar15] = (char)((ulong)iVar4 >> 0x38);
        buffer[uVar14 + 1] = (char)((ulong)iVar4 >> 0x30);
        buffer[uVar14 + 2] = (char)((ulong)iVar4 >> 0x28);
        buffer[uVar14 + 3] = (char)((ulong)iVar4 >> 0x20);
        buffer[uVar14 + 4] = (char)((ulong)iVar4 >> 0x18);
        buffer[uVar14 + 5] = (char)((ulong)iVar4 >> 0x10);
        uVar1 = uVar14 + 7;
        buffer[uVar14 + 6] = (char)((ulong)iVar4 >> 8);
        uVar14 = uVar14 + 8;
        buffer[uVar1] = (char)iVar4;
        break;
      case 'e':
      case 'g':
      case 'j':
      case 'k':
      case 'l':
      case 'n':
      case 'o':
      case 'p':
      case 'q':
        goto switchD_0011447f_caseD_65;
      case 'm':
        lVar10 = uVar9 * 0x10;
        buffer[uVar15] = args[uVar9].T;
        buffer[uVar14 + 1] = args->m[lVar10 + 1];
        uVar1 = uVar14 + 3;
        buffer[uVar14 + 2] = args->m[lVar10 + 2];
        uVar14 = uVar14 + 4;
        buffer[uVar1] = args->m[lVar10 + 3];
        break;
      case 's':
        goto switchD_0011447f_caseD_73;
      default:
        if (cVar5 != 'S') goto switchD_0011447f_caseD_65;
switchD_0011447f_caseD_73:
        for (pcVar16 = args[uVar9].s; *pcVar16 != '\0'; pcVar16 = pcVar16 + 1) {
          uVar15 = (ulong)uVar14;
          uVar14 = uVar14 + 1;
          buffer[uVar15] = *pcVar16;
        }
        uVar14 = (uVar14 & 0xfffffffc) + 4;
      }
      uVar13 = uVar13 + 1;
      uVar6 = uVar6 - 1;
      goto switchD_0011447f_caseD_65;
    }
    __n = 0;
    memset(buffer,0,len);
  }
  return __n;
}

Assistant:

size_t rtosc_amessage(char              *buffer,
                      size_t             len,
                      const char        *address,
                      const char        *arguments,
                      const rtosc_arg_t *args)
{
    const size_t total_len = vsosc_null(address, arguments, args);

    if(!buffer)
        return total_len;

    //Abort if the message cannot fit
    if(total_len>len) {
        memset(buffer, 0, len);
        return 0;
    }

    memset(buffer, 0, total_len);

    unsigned pos = 0;
    while(*address)
        buffer[pos++] = *address++;

    //get 32 bit alignment
    pos += 4-pos%4;

    buffer[pos++] = ',';

    const char *arg_str = arguments;
    while(*arg_str)
        buffer[pos++] = *arg_str++;

    pos += 4-pos%4;

    unsigned toparse = nreserved(arguments);
    unsigned arg_pos = 0;
    while(toparse)
    {
        char arg = *arguments++;
        assert(arg);
        int32_t i;
        int64_t d;
        const uint8_t *m;
        const char *s;
        const unsigned char *u;
        rtosc_blob_t b;
        switch(arg) {
            case 'h':
            case 't':
            case 'd':
                d = args[arg_pos++].t;
                buffer[pos++] = ((d>>56) & 0xff);
                buffer[pos++] = ((d>>48) & 0xff);
                buffer[pos++] = ((d>>40) & 0xff);
                buffer[pos++] = ((d>>32) & 0xff);
                buffer[pos++] = ((d>>24) & 0xff);
                buffer[pos++] = ((d>>16) & 0xff);
                buffer[pos++] = ((d>>8) & 0xff);
                buffer[pos++] = (d & 0xff);
                --toparse;
                break;
            case 'r':
            case 'f':
            case 'c':
            case 'i':
                i = args[arg_pos++].i;
                buffer[pos++] = ((i>>24) & 0xff);
                buffer[pos++] = ((i>>16) & 0xff);
                buffer[pos++] = ((i>>8) & 0xff);
                buffer[pos++] = (i & 0xff);
                --toparse;
                break;
            case 'm':
                //TODO verify ordering of spec
                m = args[arg_pos++].m;
                buffer[pos++] = m[0];
                buffer[pos++] = m[1];
                buffer[pos++] = m[2];
                buffer[pos++] = m[3];
                --toparse;
                break;
            case 'S':
            case 's':
                s = args[arg_pos++].s;
                while(*s)
                    buffer[pos++] = *s++;
                pos += 4-pos%4;
                --toparse;
                break;
            case 'b':
                b = args[arg_pos++].b;
                i = b.len;
                buffer[pos++] = ((i>>24) & 0xff);
                buffer[pos++] = ((i>>16) & 0xff);
                buffer[pos++] = ((i>>8) & 0xff);
                buffer[pos++] = (i & 0xff);
                u = b.data;
                if(u) {
                    while(i--)
                        buffer[pos++] = *u++;
                }
                else
                    pos += i;
                if(pos%4)
                    pos += 4-pos%4;
                --toparse;
                break;
            default:
                ;
        }
    }

    return pos;
}